

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  byte bVar31;
  byte bVar32;
  int iVar33;
  ulong uVar34;
  byte bVar35;
  undefined1 (*pauVar36) [32];
  long lVar37;
  byte bVar38;
  uint uVar39;
  undefined4 uVar40;
  ulong uVar41;
  NodeRef root;
  ulong *puVar42;
  bool bVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar77 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d19;
  RayQueryContext *local_5d18;
  size_t local_5d10;
  undefined4 local_5d04;
  RayK<8> *local_5d00;
  BVH *local_5cf8;
  Intersectors *local_5cf0;
  ulong local_5ce8;
  undefined1 local_5ce0 [32];
  RTCFilterFunctionNArguments local_5cb0;
  undefined1 local_5c80 [32];
  int local_5c60;
  int iStack_5c5c;
  int iStack_5c58;
  int iStack_5c54;
  int iStack_5c50;
  int iStack_5c4c;
  int iStack_5c48;
  int iStack_5c44;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b60;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined4 uStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  undefined4 uStack_5a04;
  undefined1 local_5a00 [32];
  int local_59e0;
  int iStack_59dc;
  int iStack_59d8;
  int iStack_59d4;
  int iStack_59d0;
  int iStack_59cc;
  int iStack_59c8;
  int iStack_59c4;
  uint local_59c0;
  uint uStack_59bc;
  uint uStack_59b8;
  uint uStack_59b4;
  uint uStack_59b0;
  uint uStack_59ac;
  uint uStack_59a8;
  uint uStack_59a4;
  uint local_59a0;
  uint uStack_599c;
  uint uStack_5998;
  uint uStack_5994;
  uint uStack_5990;
  uint uStack_598c;
  uint uStack_5988;
  uint uStack_5984;
  uint local_5980;
  uint uStack_597c;
  uint uStack_5978;
  uint uStack_5974;
  uint uStack_5970;
  uint uStack_596c;
  uint uStack_5968;
  uint uStack_5964;
  undefined1 local_5960 [32];
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  local_5cf8 = (BVH *)This->ptr;
  local_5808 = (local_5cf8->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar48 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar45 = ZEXT816(0) << 0x40;
      uVar44 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar45),5);
      uVar41 = vpcmpeqd_avx512vl(auVar48,(undefined1  [32])valid_i->field_0);
      uVar44 = uVar44 & uVar41;
      bVar38 = (byte)uVar44;
      if (bVar38 != 0) {
        local_5b60._0_4_ = *(undefined4 *)ray;
        local_5b60._4_4_ = *(undefined4 *)(ray + 4);
        local_5b60._8_4_ = *(undefined4 *)(ray + 8);
        local_5b60._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5b60._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5b60._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5b60._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5b60._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5b60._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5b60._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5b60._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5b60._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5b60._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5b60._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5b60._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5b60._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5b60._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5b60._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5b60._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5b60._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5b60._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5b60._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5b60._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5b60._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5b00 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5ac0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar50._16_4_ = 0x7fffffff;
        auVar50._20_4_ = 0x7fffffff;
        auVar50._24_4_ = 0x7fffffff;
        auVar50._28_4_ = 0x7fffffff;
        auVar48 = vandps_avx(auVar50,local_5b00);
        auVar46._8_4_ = 0x219392ef;
        auVar46._0_8_ = 0x219392ef219392ef;
        auVar46._12_4_ = 0x219392ef;
        auVar46._16_4_ = 0x219392ef;
        auVar46._20_4_ = 0x219392ef;
        auVar46._24_4_ = 0x219392ef;
        auVar46._28_4_ = 0x219392ef;
        uVar41 = vcmpps_avx512vl(auVar48,auVar46,1);
        bVar43 = (bool)((byte)uVar41 & 1);
        auVar47._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._0_4_;
        bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._4_4_;
        bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._8_4_;
        bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._12_4_;
        bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._16_4_;
        bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._20_4_;
        bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._24_4_;
        bVar43 = SUB81(uVar41 >> 7,0);
        auVar47._28_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5b00._28_4_;
        auVar48 = vandps_avx(auVar50,local_5ae0);
        uVar41 = vcmpps_avx512vl(auVar48,auVar46,1);
        bVar43 = (bool)((byte)uVar41 & 1);
        auVar51._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._0_4_;
        bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._4_4_;
        bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._8_4_;
        bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._12_4_;
        bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._16_4_;
        bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._20_4_;
        bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._24_4_;
        bVar43 = SUB81(uVar41 >> 7,0);
        auVar51._28_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ae0._28_4_;
        auVar48 = vandps_avx(auVar50,local_5ac0);
        uVar41 = vcmpps_avx512vl(auVar48,auVar46,1);
        bVar43 = (bool)((byte)uVar41 & 1);
        auVar48._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._0_4_;
        bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._4_4_;
        bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._8_4_;
        bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._12_4_;
        bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._16_4_;
        bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._20_4_;
        bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._24_4_;
        bVar43 = SUB81(uVar41 >> 7,0);
        auVar48._28_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * local_5ac0._28_4_;
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar49._16_4_ = 0x3f800000;
        auVar49._20_4_ = 0x3f800000;
        auVar49._24_4_ = 0x3f800000;
        auVar49._28_4_ = 0x3f800000;
        auVar46 = vrcp14ps_avx512vl(auVar47);
        auVar18 = vfnmadd213ps_fma(auVar47,auVar46,auVar49);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar46,auVar46);
        auVar47 = vrcp14ps_avx512vl(auVar51);
        auVar19 = vfnmadd213ps_fma(auVar51,auVar47,auVar49);
        auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar47,auVar47);
        auVar47 = vrcp14ps_avx512vl(auVar48);
        auVar20 = vfnmadd213ps_fma(auVar48,auVar47,auVar49);
        local_5aa0 = ZEXT1632(auVar18);
        local_5a80 = ZEXT1632(auVar19);
        auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar47,auVar47);
        local_5a60 = ZEXT1632(auVar20);
        local_5a40 = (float)local_5b60._0_4_ * auVar18._0_4_;
        fStack_5a3c = (float)local_5b60._4_4_ * auVar18._4_4_;
        fStack_5a38 = (float)local_5b60._8_4_ * auVar18._8_4_;
        fStack_5a34 = (float)local_5b60._12_4_ * auVar18._12_4_;
        fStack_5a30 = (float)local_5b60._16_4_ * 0.0;
        fStack_5a2c = (float)local_5b60._20_4_ * 0.0;
        fStack_5a28 = (float)local_5b60._24_4_ * 0.0;
        local_5a20 = (float)local_5b60._32_4_ * auVar19._0_4_;
        fStack_5a1c = (float)local_5b60._36_4_ * auVar19._4_4_;
        fStack_5a18 = (float)local_5b60._40_4_ * auVar19._8_4_;
        fStack_5a14 = (float)local_5b60._44_4_ * auVar19._12_4_;
        fStack_5a10 = (float)local_5b60._48_4_ * 0.0;
        fStack_5a0c = (float)local_5b60._52_4_ * 0.0;
        fStack_5a08 = (float)local_5b60._56_4_ * 0.0;
        local_5a00._4_4_ = (float)local_5b60._68_4_ * auVar20._4_4_;
        local_5a00._0_4_ = (float)local_5b60._64_4_ * auVar20._0_4_;
        local_5a00._8_4_ = (float)local_5b60._72_4_ * auVar20._8_4_;
        local_5a00._12_4_ = (float)local_5b60._76_4_ * auVar20._12_4_;
        local_5a00._16_4_ = (float)local_5b60._80_4_ * 0.0;
        local_5a00._20_4_ = (float)local_5b60._84_4_ * 0.0;
        local_5a00._24_4_ = (float)local_5b60._88_4_ * 0.0;
        local_5a00._28_4_ = local_5b60._92_4_;
        uVar41 = vcmpps_avx512vl(ZEXT1632(auVar18),ZEXT1632(auVar45),1);
        auVar48 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_59e0 = (uint)((byte)uVar41 & 1) * auVar48._0_4_;
        iStack_59dc = (uint)((byte)(uVar41 >> 1) & 1) * auVar48._4_4_;
        iStack_59d8 = (uint)((byte)(uVar41 >> 2) & 1) * auVar48._8_4_;
        iStack_59d4 = (uint)((byte)(uVar41 >> 3) & 1) * auVar48._12_4_;
        iStack_59d0 = (uint)((byte)(uVar41 >> 4) & 1) * auVar48._16_4_;
        iStack_59cc = (uint)((byte)(uVar41 >> 5) & 1) * auVar48._20_4_;
        iStack_59c8 = (uint)((byte)(uVar41 >> 6) & 1) * auVar48._24_4_;
        iStack_59c4 = (uint)(byte)(uVar41 >> 7) * auVar48._28_4_;
        auVar47 = ZEXT1632(auVar45);
        uVar41 = vcmpps_avx512vl(ZEXT1632(auVar19),auVar47,5);
        auVar48 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar43 = (bool)((byte)uVar41 & 1);
        local_59c0 = (uint)bVar43 * auVar48._0_4_ | (uint)!bVar43 * 0x60;
        bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
        uStack_59bc = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * 0x60;
        bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
        uStack_59b8 = (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * 0x60;
        bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
        uStack_59b4 = (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * 0x60;
        bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
        uStack_59b0 = (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * 0x60;
        bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
        uStack_59ac = (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * 0x60;
        bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
        uStack_59a8 = (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * 0x60;
        bVar43 = SUB81(uVar41 >> 7,0);
        uStack_59a4 = (uint)bVar43 * auVar48._28_4_ | (uint)!bVar43 * 0x60;
        uVar41 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar47,5);
        auVar48 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar43 = (bool)((byte)uVar41 & 1);
        local_59a0 = (uint)bVar43 * auVar48._0_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
        uStack_599c = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
        uStack_5998 = (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
        uStack_5994 = (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
        uStack_5990 = (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
        uStack_598c = (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
        uStack_5988 = (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * 0xa0;
        bVar43 = SUB81(uVar41 >> 7,0);
        uStack_5984 = (uint)bVar43 * auVar48._28_4_ | (uint)!bVar43 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar75 = ZEXT3264(local_4680);
        auVar48 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar47);
        local_5980 = (uint)(bVar38 & 1) * auVar48._0_4_ |
                     (uint)!(bool)(bVar38 & 1) * local_4680._0_4_;
        bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
        uStack_597c = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * local_4680._4_4_;
        bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
        uStack_5978 = (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * local_4680._8_4_;
        bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
        uStack_5974 = (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * local_4680._12_4_;
        bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
        uStack_5970 = (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * local_4680._16_4_;
        bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
        uStack_596c = (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * local_4680._20_4_;
        bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
        uStack_5968 = (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * local_4680._24_4_;
        bVar43 = SUB81(uVar44 >> 7,0);
        uStack_5964 = (uint)bVar43 * auVar48._28_4_ | (uint)!bVar43 * local_4680._28_4_;
        local_5d04 = (undefined4)uVar44;
        auVar48 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar47);
        local_5960._0_4_ =
             (uint)(bVar38 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar38 & 1) * -0x800000;
        bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
        local_5960._4_4_ = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * -0x800000;
        bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
        local_5960._8_4_ = (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * -0x800000;
        bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
        local_5960._12_4_ = (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * -0x800000;
        bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
        local_5960._16_4_ = (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * -0x800000;
        bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
        local_5960._20_4_ = (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * -0x800000;
        bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
        local_5960._24_4_ = (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * -0x800000;
        bVar43 = SUB81(uVar44 >> 7,0);
        local_5960._28_4_ = (uint)bVar43 * auVar48._28_4_ | (uint)!bVar43 * -0x800000;
        bVar38 = ~bVar38;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar39 = 7;
        }
        else {
          uVar39 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d00 = ray + 0x100;
        puVar42 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar36 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5980;
        uStack_465c = uStack_597c;
        uStack_4658 = uStack_5978;
        uStack_4654 = uStack_5974;
        uStack_4650 = uStack_5970;
        uStack_464c = uStack_596c;
        uStack_4648 = uStack_5968;
        uStack_4644 = uStack_5964;
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar76 = ZEXT3264(auVar48);
        auVar45 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar77 = ZEXT1664(auVar45);
        local_5d18 = context;
        local_5cf0 = This;
        uStack_5a24 = local_5b60._28_4_;
        uStack_5a04 = local_5b60._60_4_;
LAB_01f56685:
        do {
          do {
            root.ptr = puVar42[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01f56eef;
            puVar42 = puVar42 + -1;
            pauVar36 = pauVar36 + -1;
            auVar48 = *pauVar36;
            auVar58 = ZEXT3264(auVar48);
            uVar44 = vcmpps_avx512vl(auVar48,local_5960,1);
          } while ((char)uVar44 == '\0');
          uVar40 = (undefined4)uVar44;
          if (uVar39 < (uint)POPCOUNT(uVar40)) {
LAB_01f566c7:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01f56eef;
                uVar15 = vcmpps_avx512vl(auVar58._0_32_,local_5960,9);
                if ((char)uVar15 == '\0') goto LAB_01f56685;
                local_5ce8 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar31 = bVar38;
                if (local_5ce8 == 0) goto LAB_01f56ddb;
                bVar31 = ~bVar38;
                lVar37 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                uVar44 = 0;
                goto LAB_01f56892;
              }
              uVar44 = 8;
              lVar37 = 0;
              auVar48 = auVar75._0_32_;
              do {
                uVar41 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar37 * 8);
                if (uVar41 == 8) {
                  auVar58 = ZEXT3264(auVar48);
                  break;
                }
                auVar28._4_4_ = fStack_5a3c;
                auVar28._0_4_ = local_5a40;
                auVar28._8_4_ = fStack_5a38;
                auVar28._12_4_ = fStack_5a34;
                auVar28._16_4_ = fStack_5a30;
                auVar28._20_4_ = fStack_5a2c;
                auVar28._24_4_ = fStack_5a28;
                auVar28._28_4_ = uStack_5a24;
                uVar40 = *(undefined4 *)(root.ptr + 0x40 + lVar37 * 4);
                auVar64._4_4_ = uVar40;
                auVar64._0_4_ = uVar40;
                auVar64._8_4_ = uVar40;
                auVar64._12_4_ = uVar40;
                auVar64._16_4_ = uVar40;
                auVar64._20_4_ = uVar40;
                auVar64._24_4_ = uVar40;
                auVar64._28_4_ = uVar40;
                auVar45 = vfmsub132ps_fma(auVar64,auVar28,local_5aa0);
                auVar29._4_4_ = fStack_5a1c;
                auVar29._0_4_ = local_5a20;
                auVar29._8_4_ = fStack_5a18;
                auVar29._12_4_ = fStack_5a14;
                auVar29._16_4_ = fStack_5a10;
                auVar29._20_4_ = fStack_5a0c;
                auVar29._24_4_ = fStack_5a08;
                auVar29._28_4_ = uStack_5a04;
                uVar40 = *(undefined4 *)(root.ptr + 0x80 + lVar37 * 4);
                auVar68._4_4_ = uVar40;
                auVar68._0_4_ = uVar40;
                auVar68._8_4_ = uVar40;
                auVar68._12_4_ = uVar40;
                auVar68._16_4_ = uVar40;
                auVar68._20_4_ = uVar40;
                auVar68._24_4_ = uVar40;
                auVar68._28_4_ = uVar40;
                uVar40 = *(undefined4 *)(root.ptr + 0xc0 + lVar37 * 4);
                auVar71._4_4_ = uVar40;
                auVar71._0_4_ = uVar40;
                auVar71._8_4_ = uVar40;
                auVar71._12_4_ = uVar40;
                auVar71._16_4_ = uVar40;
                auVar71._20_4_ = uVar40;
                auVar71._24_4_ = uVar40;
                auVar71._28_4_ = uVar40;
                auVar18 = vfmsub132ps_fma(auVar68,auVar29,local_5a80);
                auVar19 = vfmsub132ps_fma(auVar71,local_5a00,local_5a60);
                uVar40 = *(undefined4 *)(root.ptr + 0x60 + lVar37 * 4);
                auVar21._4_4_ = uVar40;
                auVar21._0_4_ = uVar40;
                auVar21._8_4_ = uVar40;
                auVar21._12_4_ = uVar40;
                auVar21._16_4_ = uVar40;
                auVar21._20_4_ = uVar40;
                auVar21._24_4_ = uVar40;
                auVar21._28_4_ = uVar40;
                auVar46 = vfmsub132ps_avx512vl(local_5aa0,auVar28,auVar21);
                uVar40 = *(undefined4 *)(root.ptr + 0xa0 + lVar37 * 4);
                auVar22._4_4_ = uVar40;
                auVar22._0_4_ = uVar40;
                auVar22._8_4_ = uVar40;
                auVar22._12_4_ = uVar40;
                auVar22._16_4_ = uVar40;
                auVar22._20_4_ = uVar40;
                auVar22._24_4_ = uVar40;
                auVar22._28_4_ = uVar40;
                auVar49 = vfmsub132ps_avx512vl(local_5a80,auVar29,auVar22);
                uVar40 = *(undefined4 *)(root.ptr + 0xe0 + lVar37 * 4);
                auVar23._4_4_ = uVar40;
                auVar23._0_4_ = uVar40;
                auVar23._8_4_ = uVar40;
                auVar23._12_4_ = uVar40;
                auVar23._16_4_ = uVar40;
                auVar23._20_4_ = uVar40;
                auVar23._24_4_ = uVar40;
                auVar23._28_4_ = uVar40;
                auVar50 = vfmsub132ps_avx512vl(local_5a60,local_5a00,auVar23);
                auVar47 = vpminsd_avx2(ZEXT1632(auVar45),auVar46);
                auVar51 = vpminsd_avx2(ZEXT1632(auVar18),auVar49);
                auVar47 = vpmaxsd_avx2(auVar47,auVar51);
                auVar51 = vpminsd_avx2(ZEXT1632(auVar19),auVar50);
                auVar47 = vpmaxsd_avx2(auVar47,auVar51);
                auVar51 = vpmaxsd_avx2(ZEXT1632(auVar45),auVar46);
                auVar46 = vpmaxsd_avx2(ZEXT1632(auVar18),auVar49);
                auVar46 = vpminsd_avx2(auVar51,auVar46);
                auVar51 = vpmaxsd_avx2(ZEXT1632(auVar19),auVar50);
                auVar46 = vpminsd_avx2(auVar46,auVar51);
                auVar30._4_4_ = uStack_597c;
                auVar30._0_4_ = local_5980;
                auVar30._8_4_ = uStack_5978;
                auVar30._12_4_ = uStack_5974;
                auVar30._16_4_ = uStack_5970;
                auVar30._20_4_ = uStack_596c;
                auVar30._24_4_ = uStack_5968;
                auVar30._28_4_ = uStack_5964;
                auVar51 = vpmaxsd_avx2(auVar47,auVar30);
                auVar46 = vpminsd_avx2(auVar46,local_5960);
                uVar34 = vpcmpd_avx512vl(auVar51,auVar46,2);
                if ((byte)uVar34 == 0) {
                  auVar58 = ZEXT3264(auVar48);
                  uVar41 = uVar44;
                }
                else {
                  auVar51 = vblendmps_avx512vl(auVar75._0_32_,auVar47);
                  bVar43 = (bool)((byte)uVar34 & 1);
                  bVar8 = (bool)((byte)(uVar34 >> 1) & 1);
                  bVar9 = (bool)((byte)(uVar34 >> 2) & 1);
                  bVar10 = (bool)((byte)(uVar34 >> 3) & 1);
                  bVar11 = (bool)((byte)(uVar34 >> 4) & 1);
                  bVar12 = (bool)((byte)(uVar34 >> 5) & 1);
                  bVar13 = (bool)((byte)(uVar34 >> 6) & 1);
                  bVar14 = SUB81(uVar34 >> 7,0);
                  auVar58 = ZEXT3264(CONCAT428((uint)bVar14 * auVar51._28_4_ |
                                               (uint)!bVar14 * auVar47._28_4_,
                                               CONCAT424((uint)bVar13 * auVar51._24_4_ |
                                                         (uint)!bVar13 * auVar47._24_4_,
                                                         CONCAT420((uint)bVar12 * auVar51._20_4_ |
                                                                   (uint)!bVar12 * auVar47._20_4_,
                                                                   CONCAT416((uint)bVar11 *
                                                                             auVar51._16_4_ |
                                                                             (uint)!bVar11 *
                                                                             auVar47._16_4_,
                                                                             CONCAT412((uint)bVar10
                                                                                       * auVar51.
                                                  _12_4_ | (uint)!bVar10 * auVar47._12_4_,
                                                  CONCAT48((uint)bVar9 * auVar51._8_4_ |
                                                           (uint)!bVar9 * auVar47._8_4_,
                                                           CONCAT44((uint)bVar8 * auVar51._4_4_ |
                                                                    (uint)!bVar8 * auVar47._4_4_,
                                                                    (uint)bVar43 * auVar51._0_4_ |
                                                                    (uint)!bVar43 * auVar47._0_4_)))
                                                  )))));
                  if (uVar44 != 8) {
                    *puVar42 = uVar44;
                    puVar42 = puVar42 + 1;
                    *pauVar36 = auVar48;
                    pauVar36 = pauVar36 + 1;
                  }
                }
                uVar44 = uVar41;
                lVar37 = lVar37 + 1;
                auVar48 = auVar58._0_32_;
              } while (lVar37 != 8);
              iVar33 = 4;
              if (uVar44 == 8) goto LAB_01f56836;
              uVar15 = vcmpps_avx512vl(auVar58._0_32_,local_5960,9);
              root.ptr = uVar44;
            } while ((byte)uVar39 < (byte)POPCOUNT((int)uVar15));
            *puVar42 = uVar44;
            puVar42 = puVar42 + 1;
            *pauVar36 = auVar58._0_32_;
            pauVar36 = pauVar36 + 1;
          }
          else {
            do {
              local_5ce0 = auVar48;
              local_5d10 = 0;
              for (uVar41 = uVar44; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                local_5d10 = local_5d10 + 1;
              }
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar43 = occluded1(local_5cf0,local_5cf8,root,local_5d10,&local_5d19,ray,
                                 (TravRayK<8,_false> *)&local_5b60.field_0,context);
              bVar31 = (byte)(1 << ((uint)local_5d10 & 0x1f));
              if (!bVar43) {
                bVar31 = 0;
              }
              bVar38 = bVar38 | bVar31;
              uVar44 = uVar44 - 1 & uVar44;
              context = local_5d18;
              auVar48 = local_5ce0;
            } while (uVar44 != 0);
            if (bVar38 == 0xff) {
              iVar33 = 3;
            }
            else {
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5960._0_4_ =
                   (uint)(bVar38 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar38 & 1) * local_5960._0_4_
              ;
              bVar43 = (bool)(bVar38 >> 1 & 1);
              local_5960._4_4_ = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * local_5960._4_4_;
              bVar43 = (bool)(bVar38 >> 2 & 1);
              local_5960._8_4_ = (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * local_5960._8_4_;
              bVar43 = (bool)(bVar38 >> 3 & 1);
              local_5960._12_4_ = (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * local_5960._12_4_;
              bVar43 = (bool)(bVar38 >> 4 & 1);
              local_5960._16_4_ = (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * local_5960._16_4_;
              bVar43 = (bool)(bVar38 >> 5 & 1);
              local_5960._20_4_ = (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * local_5960._20_4_;
              bVar43 = (bool)(bVar38 >> 6 & 1);
              local_5960._24_4_ = (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * local_5960._24_4_;
              local_5960._28_4_ =
                   (uint)(bVar38 >> 7) * auVar48._28_4_ |
                   (uint)!(bool)(bVar38 >> 7) * local_5960._28_4_;
              iVar33 = 2;
            }
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar75 = ZEXT3264(auVar48);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar76 = ZEXT3264(auVar48);
            auVar45 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
            auVar77 = ZEXT1664(auVar45);
            auVar58 = ZEXT3264(local_5ce0);
            if (uVar39 < (uint)POPCOUNT(uVar40)) goto LAB_01f566c7;
          }
LAB_01f56836:
        } while ((iVar33 == 4) || (iVar33 == 2));
LAB_01f56eef:
        bVar38 = bVar38 & (byte)local_5d04;
        bVar43 = (bool)(bVar38 >> 1 & 1);
        bVar8 = (bool)(bVar38 >> 2 & 1);
        bVar9 = (bool)(bVar38 >> 3 & 1);
        bVar10 = (bool)(bVar38 >> 4 & 1);
        bVar11 = (bool)(bVar38 >> 5 & 1);
        bVar12 = (bool)(bVar38 >> 6 & 1);
        *(uint *)local_5d00 =
             (uint)(bVar38 & 1) * -0x800000 | (uint)!(bool)(bVar38 & 1) * *(int *)local_5d00;
        *(uint *)(local_5d00 + 4) =
             (uint)bVar43 * -0x800000 | (uint)!bVar43 * *(int *)(local_5d00 + 4);
        *(uint *)(local_5d00 + 8) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_5d00 + 8);
        *(uint *)(local_5d00 + 0xc) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_5d00 + 0xc);
        *(uint *)(local_5d00 + 0x10) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_5d00 + 0x10);
        *(uint *)(local_5d00 + 0x14) =
             (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_5d00 + 0x14);
        *(uint *)(local_5d00 + 0x18) =
             (uint)bVar12 * -0x800000 | (uint)!bVar12 * *(int *)(local_5d00 + 0x18);
        *(uint *)(local_5d00 + 0x1c) =
             (uint)(bVar38 >> 7) * -0x800000 |
             (uint)!(bool)(bVar38 >> 7) * *(int *)(local_5d00 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar44 = uVar44 + 1;
    lVar37 = lVar37 + 0xb0;
    if (local_5ce8 <= uVar44) break;
LAB_01f56892:
    local_5ce0._0_8_ = uVar44;
    uVar41 = 0;
    bVar32 = bVar31;
    while (uVar34 = (ulong)*(uint *)(lVar37 + -0x10 + uVar41 * 4), uVar34 != 0xffffffff) {
      uVar40 = *(undefined4 *)(lVar37 + -0xa0 + uVar41 * 4);
      auVar60._4_4_ = uVar40;
      auVar60._0_4_ = uVar40;
      auVar60._8_4_ = uVar40;
      auVar60._12_4_ = uVar40;
      auVar60._16_4_ = uVar40;
      auVar60._20_4_ = uVar40;
      auVar60._24_4_ = uVar40;
      auVar60._28_4_ = uVar40;
      uVar40 = *(undefined4 *)(lVar37 + -0x90 + uVar41 * 4);
      auVar65._4_4_ = uVar40;
      auVar65._0_4_ = uVar40;
      auVar65._8_4_ = uVar40;
      auVar65._12_4_ = uVar40;
      auVar65._16_4_ = uVar40;
      auVar65._20_4_ = uVar40;
      auVar65._24_4_ = uVar40;
      auVar65._28_4_ = uVar40;
      uVar40 = *(undefined4 *)(lVar37 + -0x80 + uVar41 * 4);
      auVar69._4_4_ = uVar40;
      auVar69._0_4_ = uVar40;
      auVar69._8_4_ = uVar40;
      auVar69._12_4_ = uVar40;
      auVar69._16_4_ = uVar40;
      auVar69._20_4_ = uVar40;
      auVar69._24_4_ = uVar40;
      auVar69._28_4_ = uVar40;
      fVar1 = *(float *)(lVar37 + -0x70 + uVar41 * 4);
      auVar62._4_4_ = fVar1;
      auVar62._0_4_ = fVar1;
      auVar62._8_4_ = fVar1;
      auVar62._12_4_ = fVar1;
      auVar62._16_4_ = fVar1;
      auVar62._20_4_ = fVar1;
      auVar62._24_4_ = fVar1;
      auVar62._28_4_ = fVar1;
      uVar40 = *(undefined4 *)(lVar37 + -0x60 + uVar41 * 4);
      auVar45._4_4_ = uVar40;
      auVar45._0_4_ = uVar40;
      auVar45._8_4_ = uVar40;
      auVar45._12_4_ = uVar40;
      auVar67._16_4_ = uVar40;
      auVar67._0_16_ = auVar45;
      auVar67._20_4_ = uVar40;
      auVar67._24_4_ = uVar40;
      auVar67._28_4_ = uVar40;
      fVar2 = *(float *)(lVar37 + -0x50 + uVar41 * 4);
      auVar72._4_4_ = fVar2;
      auVar72._0_4_ = fVar2;
      auVar72._8_4_ = fVar2;
      auVar72._12_4_ = fVar2;
      auVar72._16_4_ = fVar2;
      auVar72._20_4_ = fVar2;
      auVar72._24_4_ = fVar2;
      auVar72._28_4_ = fVar2;
      fVar3 = *(float *)(lVar37 + -0x40 + uVar41 * 4);
      auVar70._4_4_ = fVar3;
      auVar70._0_4_ = fVar3;
      auVar70._8_4_ = fVar3;
      auVar70._12_4_ = fVar3;
      auVar70._16_4_ = fVar3;
      auVar70._20_4_ = fVar3;
      auVar70._24_4_ = fVar3;
      auVar70._28_4_ = fVar3;
      fVar4 = *(float *)(lVar37 + -0x30 + uVar41 * 4);
      auVar74._4_4_ = fVar4;
      auVar74._0_4_ = fVar4;
      auVar74._8_4_ = fVar4;
      auVar74._12_4_ = fVar4;
      auVar74._16_4_ = fVar4;
      auVar74._20_4_ = fVar4;
      auVar74._24_4_ = fVar4;
      auVar74._28_4_ = fVar4;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar37 + -0x20 + uVar41 * 4)));
      auVar45 = vmulss_avx512f(auVar45,auVar52._0_16_);
      auVar53._0_4_ = auVar45._0_4_;
      auVar53._4_4_ = auVar53._0_4_;
      auVar53._8_4_ = auVar53._0_4_;
      auVar53._12_4_ = auVar53._0_4_;
      auVar53._16_4_ = auVar53._0_4_;
      auVar53._20_4_ = auVar53._0_4_;
      auVar53._24_4_ = auVar53._0_4_;
      auVar53._28_4_ = auVar53._0_4_;
      auVar18 = vfmsub231ps_fma(auVar53,auVar74,auVar72);
      fVar3 = fVar2 * fVar3;
      auVar55._4_4_ = fVar3;
      auVar55._0_4_ = fVar3;
      auVar55._8_4_ = fVar3;
      auVar55._12_4_ = fVar3;
      auVar55._16_4_ = fVar3;
      auVar55._20_4_ = fVar3;
      auVar55._24_4_ = fVar3;
      auVar55._28_4_ = fVar3;
      auVar53 = vfmsub231ps_avx512vl(auVar55,auVar52,auVar62);
      fVar4 = fVar4 * fVar1;
      auVar59._4_4_ = fVar4;
      auVar59._0_4_ = fVar4;
      auVar59._8_4_ = fVar4;
      auVar59._12_4_ = fVar4;
      auVar59._16_4_ = fVar4;
      auVar59._20_4_ = fVar4;
      auVar59._24_4_ = fVar4;
      auVar59._28_4_ = fVar4;
      auVar19 = vfmsub231ps_fma(auVar59,auVar70,auVar67);
      auVar46 = vsubps_avx(auVar60,*(undefined1 (*) [32])ray);
      auVar49 = vsubps_avx(auVar65,*(undefined1 (*) [32])(ray + 0x20));
      auVar50 = vsubps_avx(auVar69,*(undefined1 (*) [32])(ray + 0x40));
      auVar48 = *(undefined1 (*) [32])(ray + 0x80);
      auVar47 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar51 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar54 = vmulps_avx512vl(auVar47,auVar50);
      auVar20 = vfmsub231ps_fma(auVar54,auVar49,auVar51);
      auVar58._0_4_ = auVar51._0_4_ * auVar46._0_4_;
      auVar58._4_4_ = auVar51._4_4_ * auVar46._4_4_;
      auVar58._8_4_ = auVar51._8_4_ * auVar46._8_4_;
      auVar58._12_4_ = auVar51._12_4_ * auVar46._12_4_;
      auVar58._16_4_ = auVar51._16_4_ * auVar46._16_4_;
      auVar58._20_4_ = auVar51._20_4_ * auVar46._20_4_;
      auVar58._28_36_ = in_ZMM13._28_36_;
      auVar58._24_4_ = auVar51._24_4_ * auVar46._24_4_;
      auVar17 = vfmsub231ps_fma(auVar58._0_32_,auVar50,auVar48);
      in_ZMM13 = ZEXT1664(auVar17);
      auVar73._0_4_ = auVar48._0_4_ * auVar49._0_4_;
      auVar73._4_4_ = auVar48._4_4_ * auVar49._4_4_;
      auVar73._8_4_ = auVar48._8_4_ * auVar49._8_4_;
      auVar73._12_4_ = auVar48._12_4_ * auVar49._12_4_;
      auVar73._16_4_ = auVar48._16_4_ * auVar49._16_4_;
      auVar73._20_4_ = auVar48._20_4_ * auVar49._20_4_;
      auVar73._28_36_ = in_ZMM14._28_36_;
      auVar73._24_4_ = auVar48._24_4_ * auVar49._24_4_;
      auVar55 = vfmsub231ps_avx512vl(auVar73._0_32_,auVar46,auVar47);
      in_ZMM14 = ZEXT3264(auVar55);
      auVar54._4_4_ = auVar19._4_4_ * auVar51._4_4_;
      auVar54._0_4_ = auVar19._0_4_ * auVar51._0_4_;
      auVar54._8_4_ = auVar19._8_4_ * auVar51._8_4_;
      auVar54._12_4_ = auVar19._12_4_ * auVar51._12_4_;
      auVar54._16_4_ = auVar51._16_4_ * 0.0;
      auVar54._20_4_ = auVar51._20_4_ * 0.0;
      auVar54._24_4_ = auVar51._24_4_ * 0.0;
      auVar54._28_4_ = auVar51._28_4_;
      auVar47 = vfmadd231ps_avx512vl(auVar54,auVar53,auVar47);
      auVar45 = vfmadd231ps_fma(auVar47,ZEXT1632(auVar18),auVar48);
      vandps_avx512vl(ZEXT1632(auVar45),auVar76._0_32_);
      auVar48 = vmulps_avx512vl(auVar52,auVar55);
      auVar48 = vfmadd231ps_avx512vl(auVar48,ZEXT1632(auVar17),auVar74);
      auVar48 = vfmadd231ps_avx512vl(auVar48,ZEXT1632(auVar20),auVar70);
      auVar48 = vxorps_avx512vl(auVar47,auVar48);
      uVar15 = vcmpps_avx512vl(auVar48,auVar77._0_32_,5);
      bVar35 = (byte)uVar15 & bVar32;
      local_5d10 = CONCAT71(local_5d10._1_7_,bVar32);
      if (bVar35 == 0) {
LAB_01f569ab:
        bVar35 = 0;
      }
      else {
        auVar52._4_4_ = fVar2 * auVar55._4_4_;
        auVar52._0_4_ = fVar2 * auVar55._0_4_;
        auVar52._8_4_ = fVar2 * auVar55._8_4_;
        auVar52._12_4_ = fVar2 * auVar55._12_4_;
        auVar52._16_4_ = fVar2 * auVar55._16_4_;
        auVar52._20_4_ = fVar2 * auVar55._20_4_;
        auVar52._24_4_ = fVar2 * auVar55._24_4_;
        auVar52._28_4_ = fVar2;
        auVar17 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar67,auVar52);
        in_ZMM13 = ZEXT1664(auVar17);
        auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar62,ZEXT1632(auVar17));
        auVar63._0_4_ = auVar47._0_4_ ^ auVar20._0_4_;
        auVar63._4_4_ = auVar47._4_4_ ^ auVar20._4_4_;
        auVar63._8_4_ = auVar47._8_4_ ^ auVar20._8_4_;
        auVar63._12_4_ = auVar47._12_4_ ^ auVar20._12_4_;
        auVar63._16_4_ = auVar47._16_4_;
        auVar63._20_4_ = auVar47._20_4_;
        auVar63._24_4_ = auVar47._24_4_;
        auVar63._28_4_ = auVar47._28_4_;
        uVar15 = vcmpps_avx512vl(auVar63,auVar77._0_32_,5);
        bVar35 = bVar35 & (byte)uVar15;
        if (bVar35 == 0) goto LAB_01f569ab;
        auVar25._8_4_ = 0x7fffffff;
        auVar25._0_8_ = 0x7fffffff7fffffff;
        auVar25._12_4_ = 0x7fffffff;
        auVar25._16_4_ = 0x7fffffff;
        auVar25._20_4_ = 0x7fffffff;
        auVar25._24_4_ = 0x7fffffff;
        auVar25._28_4_ = 0x7fffffff;
        vandps_avx512vl(ZEXT1632(auVar45),auVar25);
        auVar51 = vsubps_avx(auVar48,auVar48);
        uVar15 = vcmpps_avx512vl(auVar51,auVar63,5);
        bVar35 = bVar35 & (byte)uVar15;
        if (bVar35 == 0) goto LAB_01f569ab;
        auVar26._4_4_ = auVar50._4_4_ * auVar19._4_4_;
        auVar26._0_4_ = auVar50._0_4_ * auVar19._0_4_;
        auVar26._8_4_ = auVar50._8_4_ * auVar19._8_4_;
        auVar26._12_4_ = auVar50._12_4_ * auVar19._12_4_;
        auVar26._16_4_ = auVar50._16_4_ * 0.0;
        auVar26._20_4_ = auVar50._20_4_ * 0.0;
        auVar26._24_4_ = auVar50._24_4_ * 0.0;
        auVar26._28_4_ = auVar51._28_4_;
        auVar20 = vfmadd213ps_fma(auVar49,auVar53,auVar26);
        auVar20 = vfmadd213ps_fma(auVar46,ZEXT1632(auVar18),ZEXT1632(auVar20));
        auVar66._0_4_ = auVar48._0_4_ * *(float *)(ray + 0x60);
        auVar66._4_4_ = auVar48._4_4_ * *(float *)(ray + 100);
        auVar66._8_4_ = auVar48._8_4_ * *(float *)(ray + 0x68);
        auVar66._12_4_ = auVar48._12_4_ * *(float *)(ray + 0x6c);
        auVar66._16_4_ = auVar48._16_4_ * *(float *)(ray + 0x70);
        auVar66._20_4_ = auVar48._20_4_ * *(float *)(ray + 0x74);
        auVar66._24_4_ = auVar48._24_4_ * *(float *)(ray + 0x78);
        auVar66._28_4_ = 0;
        auVar61._0_4_ = auVar47._0_4_ ^ auVar20._0_4_;
        auVar61._4_4_ = auVar47._4_4_ ^ auVar20._4_4_;
        auVar61._8_4_ = auVar47._8_4_ ^ auVar20._8_4_;
        auVar61._12_4_ = auVar47._12_4_ ^ auVar20._12_4_;
        auVar61._16_4_ = auVar47._16_4_;
        auVar61._20_4_ = auVar47._20_4_;
        auVar61._24_4_ = auVar47._24_4_;
        auVar61._28_4_ = auVar47._28_4_;
        auVar27._4_4_ = auVar48._4_4_ * *(float *)(ray + 0x104);
        auVar27._0_4_ = auVar48._0_4_ * *(float *)(ray + 0x100);
        auVar27._8_4_ = auVar48._8_4_ * *(float *)(ray + 0x108);
        auVar27._12_4_ = auVar48._12_4_ * *(float *)(ray + 0x10c);
        auVar27._16_4_ = auVar48._16_4_ * *(float *)(ray + 0x110);
        auVar27._20_4_ = auVar48._20_4_ * *(float *)(ray + 0x114);
        auVar27._24_4_ = auVar48._24_4_ * *(float *)(ray + 0x118);
        auVar27._28_4_ = auVar51._28_4_;
        uVar15 = vcmpps_avx512vl(auVar61,auVar27,2);
        uVar16 = vcmpps_avx512vl(auVar66,auVar61,1);
        bVar35 = bVar35 & (byte)uVar15 & (byte)uVar16;
        if (bVar35 == 0) {
LAB_01f56db2:
          bVar35 = 0;
        }
        else {
          uVar15 = vcmpps_avx512vl(ZEXT1632(auVar45),ZEXT832(0) << 0x20,4);
          bVar35 = bVar35 & (byte)uVar15;
          if (bVar35 == 0) goto LAB_01f56db2;
          local_5c00 = ZEXT1632(auVar18);
          local_5c40 = ZEXT1632(auVar19);
          local_5c20 = auVar53;
          local_5be0 = auVar48;
          local_5bc0 = auVar61;
          _local_5ba0 = auVar63;
          _local_5b80 = auVar48;
        }
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar75 = ZEXT3264(auVar48);
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar76 = ZEXT3264(auVar48);
        auVar45 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
        auVar77 = ZEXT1664(auVar45);
        context = local_5d18;
      }
      auVar45 = auVar77._0_16_;
      pGVar6 = (context->scene->geometries).items[uVar34].ptr;
      uVar5 = pGVar6->mask;
      auVar57._4_4_ = uVar5;
      auVar57._0_4_ = uVar5;
      auVar57._8_4_ = uVar5;
      auVar57._12_4_ = uVar5;
      auVar57._16_4_ = uVar5;
      auVar57._20_4_ = uVar5;
      auVar57._24_4_ = uVar5;
      auVar57._28_4_ = uVar5;
      uVar15 = vptestmd_avx512vl(auVar57,*(undefined1 (*) [32])(ray + 0x120));
      bVar35 = (byte)uVar15 & bVar35;
      if (bVar35 == 0) {
      }
      else {
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar48 = vrcp14ps_avx512vl(local_5be0);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar47 = vfnmadd213ps_avx512vl(auVar48,local_5be0,auVar24);
          auVar18 = vfmadd132ps_fma(auVar47,auVar48,auVar48);
          local_58e0._4_4_ = auVar18._4_4_ * (float)local_5b80._4_4_;
          local_58e0._0_4_ = auVar18._0_4_ * (float)local_5b80._0_4_;
          local_58e0._8_4_ = auVar18._8_4_ * fStack_5b78;
          local_58e0._12_4_ = auVar18._12_4_ * fStack_5b74;
          local_58e0._16_4_ = fStack_5b70 * 0.0;
          local_58e0._20_4_ = fStack_5b6c * 0.0;
          local_58e0._24_4_ = fStack_5b68 * 0.0;
          local_58e0._28_4_ = auVar48._28_4_;
          local_58c0 = auVar18._0_4_ * (float)local_5ba0._0_4_;
          fStack_58bc = auVar18._4_4_ * (float)local_5ba0._4_4_;
          fStack_58b8 = auVar18._8_4_ * fStack_5b98;
          fStack_58b4 = auVar18._12_4_ * fStack_5b94;
          fStack_58b0 = fStack_5b90 * 0.0;
          fStack_58ac = fStack_5b8c * 0.0;
          uStack_58a4 = local_5be0._28_4_;
          fStack_58a8 = fStack_5b88 * 0.0;
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_5c00._0_8_;
          uStack_5938 = local_5c00._8_8_;
          uStack_5930 = local_5c00._16_8_;
          uStack_5928 = local_5c00._24_8_;
          local_5920 = local_5c20._0_8_;
          uStack_5918 = local_5c20._8_8_;
          uStack_5910 = local_5c20._16_8_;
          uStack_5908 = local_5c20._24_8_;
          local_5900 = local_5c40;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = context->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = context->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c60 = *(int *)(ray + 0x100);
          iStack_5c5c = *(int *)(ray + 0x104);
          iStack_5c58 = *(int *)(ray + 0x108);
          iStack_5c54 = *(int *)(ray + 0x10c);
          iStack_5c50 = *(int *)(ray + 0x110);
          iStack_5c4c = *(int *)(ray + 0x114);
          iStack_5c48 = *(int *)(ray + 0x118);
          iStack_5c44 = *(int *)(ray + 0x11c);
          auVar48 = vmulps_avx512vl(ZEXT1632(auVar18),local_5bc0);
          bVar43 = (bool)(bVar35 >> 1 & 1);
          bVar8 = (bool)(bVar35 >> 2 & 1);
          bVar9 = (bool)(bVar35 >> 3 & 1);
          bVar10 = (bool)(bVar35 >> 4 & 1);
          bVar11 = (bool)(bVar35 >> 5 & 1);
          bVar12 = (bool)(bVar35 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar35 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar35 & 1) * local_5c60;
          *(uint *)(ray + 0x104) = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * iStack_5c5c;
          *(uint *)(ray + 0x108) = (uint)bVar8 * auVar48._8_4_ | (uint)!bVar8 * iStack_5c58;
          *(uint *)(ray + 0x10c) = (uint)bVar9 * auVar48._12_4_ | (uint)!bVar9 * iStack_5c54;
          *(uint *)(ray + 0x110) = (uint)bVar10 * auVar48._16_4_ | (uint)!bVar10 * iStack_5c50;
          *(uint *)(ray + 0x114) = (uint)bVar11 * auVar48._20_4_ | (uint)!bVar11 * iStack_5c4c;
          *(uint *)(ray + 0x118) = (uint)bVar12 * auVar48._24_4_ | (uint)!bVar12 * iStack_5c48;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar35 >> 7) * auVar48._28_4_ | (uint)!(bool)(bVar35 >> 7) * iStack_5c44;
          local_5c80 = vpmovm2d_avx512vl((ulong)bVar35);
          local_5cb0.valid = (int *)local_5c80;
          local_5cb0.geometryUserPtr = pGVar6->userPtr;
          local_5cb0.context = context->user;
          local_5cb0.hit = (RTCHitN *)&local_5940;
          local_5cb0.N = 8;
          local_5cb0.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(auVar55._0_16_);
            (*pGVar6->occlusionFilterN)(&local_5cb0);
            auVar45 = vxorps_avx512vl(auVar45,auVar45);
            auVar77 = ZEXT1664(auVar45);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar76 = ZEXT3264(auVar48);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar75 = ZEXT3264(auVar48);
            context = local_5d18;
          }
          auVar45 = auVar77._0_16_;
          if (local_5c80 == (undefined1  [32])0x0) {
            uVar44 = 0;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              (*p_Var7)(&local_5cb0);
              auVar45 = vxorps_avx512vl(auVar45,auVar45);
              auVar77 = ZEXT1664(auVar45);
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar76 = ZEXT3264(auVar48);
              auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar75 = ZEXT3264(auVar48);
              context = local_5d18;
            }
            uVar44 = vptestmd_avx512vl(local_5c80,local_5c80);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar43 = (bool)((byte)uVar44 & 1);
            auVar56._0_4_ =
                 (uint)bVar43 * auVar48._0_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x100);
            bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
            auVar56._4_4_ =
                 (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x104);
            bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
            auVar56._8_4_ =
                 (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x108);
            bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
            auVar56._12_4_ =
                 (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x10c);
            bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
            auVar56._16_4_ =
                 (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x110);
            bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
            auVar56._20_4_ =
                 (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x114);
            bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
            auVar56._24_4_ =
                 (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x118);
            bVar43 = SUB81(uVar44 >> 7,0);
            auVar56._28_4_ =
                 (uint)bVar43 * auVar48._28_4_ | (uint)!bVar43 * *(int *)(local_5cb0.ray + 0x11c);
            *(undefined1 (*) [32])(local_5cb0.ray + 0x100) = auVar56;
          }
          bVar35 = (byte)uVar44;
          bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar44 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar44 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar44 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar44 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar44 >> 6) & 1);
          bVar13 = (bool)((byte)(uVar44 >> 7) & 1);
          *(uint *)local_5d00 =
               (uint)(bVar35 & 1) * *(int *)local_5d00 | (uint)!(bool)(bVar35 & 1) * local_5c60;
          *(uint *)(local_5d00 + 4) =
               (uint)bVar43 * *(int *)(local_5d00 + 4) | (uint)!bVar43 * iStack_5c5c;
          *(uint *)(local_5d00 + 8) =
               (uint)bVar8 * *(int *)(local_5d00 + 8) | (uint)!bVar8 * iStack_5c58;
          *(uint *)(local_5d00 + 0xc) =
               (uint)bVar9 * *(int *)(local_5d00 + 0xc) | (uint)!bVar9 * iStack_5c54;
          *(uint *)(local_5d00 + 0x10) =
               (uint)bVar10 * *(int *)(local_5d00 + 0x10) | (uint)!bVar10 * iStack_5c50;
          *(uint *)(local_5d00 + 0x14) =
               (uint)bVar11 * *(int *)(local_5d00 + 0x14) | (uint)!bVar11 * iStack_5c4c;
          *(uint *)(local_5d00 + 0x18) =
               (uint)bVar12 * *(int *)(local_5d00 + 0x18) | (uint)!bVar12 * iStack_5c48;
          *(uint *)(local_5d00 + 0x1c) =
               (uint)bVar13 * *(int *)(local_5d00 + 0x1c) | (uint)!bVar13 * iStack_5c44;
        }
        bVar32 = (byte)local_5d10 & ~bVar35;
      }
      uVar44 = local_5ce0._0_8_;
      if ((bVar32 == 0) || (bVar43 = 2 < uVar41, uVar41 = uVar41 + 1, bVar43)) break;
    }
    bVar31 = bVar31 & bVar32;
    if (bVar31 == 0) break;
  }
  bVar31 = ~bVar31;
LAB_01f56ddb:
  bVar38 = bVar38 | bVar31;
  if (bVar38 == 0xff) {
    bVar38 = 0xff;
    goto LAB_01f56eef;
  }
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5960._0_4_ =
       (uint)(bVar38 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar38 & 1) * local_5960._0_4_;
  bVar43 = (bool)(bVar38 >> 1 & 1);
  local_5960._4_4_ = (uint)bVar43 * auVar48._4_4_ | (uint)!bVar43 * local_5960._4_4_;
  bVar43 = (bool)(bVar38 >> 2 & 1);
  local_5960._8_4_ = (uint)bVar43 * auVar48._8_4_ | (uint)!bVar43 * local_5960._8_4_;
  bVar43 = (bool)(bVar38 >> 3 & 1);
  local_5960._12_4_ = (uint)bVar43 * auVar48._12_4_ | (uint)!bVar43 * local_5960._12_4_;
  bVar43 = (bool)(bVar38 >> 4 & 1);
  local_5960._16_4_ = (uint)bVar43 * auVar48._16_4_ | (uint)!bVar43 * local_5960._16_4_;
  bVar43 = (bool)(bVar38 >> 5 & 1);
  local_5960._20_4_ = (uint)bVar43 * auVar48._20_4_ | (uint)!bVar43 * local_5960._20_4_;
  bVar43 = (bool)(bVar38 >> 6 & 1);
  local_5960._24_4_ = (uint)bVar43 * auVar48._24_4_ | (uint)!bVar43 * local_5960._24_4_;
  local_5960._28_4_ =
       (uint)(bVar38 >> 7) * auVar48._28_4_ | (uint)!(bool)(bVar38 >> 7) * local_5960._28_4_;
  goto LAB_01f56685;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }